

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::Buffers::ErrorsTest::TestErrorsOfUnmapNamedBuffer(ErrorsTest *this)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  GLuint not_a_buffer_name;
  GLuint GVar7;
  GLuint buffer;
  GLubyte dummy_data [4];
  undefined8 local_28;
  long lVar6;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_28 = 0;
  (**(code **)(lVar6 + 0x3b8))(1);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glCreateBuffers failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x13f6);
  (*this->m_pNamedBufferStorage)((GLuint)local_28,4,(GLvoid *)((long)&local_28 + 4),0x143);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"glNamedBuffeStorage failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                  ,0x13fa);
  GVar7 = 0;
  do {
    GVar7 = GVar7 + 1;
    cVar1 = (**(code **)(lVar6 + 0xc68))(GVar7);
  } while (cVar1 != '\0');
  (*this->m_pUnmapNamedBuffer)(GVar7);
  bVar2 = ErrorCheckAndLog(this,"glUnmapNamedBuffer",0x502,
                           " if buffer is not the name of an existing buffer object.");
  (*this->m_pUnmapNamedBuffer)((GLuint)local_28);
  bVar3 = ErrorCheckAndLog(this,"glUnmapNamedBuffer",0x502,
                           " if the buffer object is not in a mapped state.");
  if ((GLuint)local_28 != 0) {
    (**(code **)(lVar6 + 0x438))(1,&local_28);
  }
  return bVar2 && bVar3;
}

Assistant:

bool ErrorsTest::TestErrorsOfUnmapNamedBuffer()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Return value. */
	bool is_ok			= true;
	bool internal_error = false;

	/* Common variables. */
	glw::GLuint  buffer		   = 0;
	glw::GLubyte dummy_data[4] = {};

	try
	{
		/* Common preparations. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		m_pNamedBufferStorage(buffer, sizeof(dummy_data), &dummy_data,
							  GL_MAP_READ_BIT | GL_MAP_WRITE_BIT | GL_DYNAMIC_STORAGE_BIT | GL_MAP_PERSISTENT_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBuffeStorage failed.");

		/* Test invalid buffer name error behavior. */
		{
			/* Prepare for invalid buffer name error behavior verification. */
			glw::GLuint not_a_buffer_name = 0;

			while (gl.isBuffer(++not_a_buffer_name))
				;

			/* Test. */
			m_pUnmapNamedBuffer(not_a_buffer_name);

			is_ok &= ErrorCheckAndLog("glUnmapNamedBuffer", GL_INVALID_OPERATION,
									  " if buffer is not the name of an existing buffer object.");
		}

		/* Test not mapped buffer error behavior verification. */
		{
			m_pUnmapNamedBuffer(buffer);

			is_ok &= ErrorCheckAndLog("glUnmapNamedBuffer", GL_INVALID_OPERATION,
									  " if the buffer object is not in a mapped state.");
		}
	}
	catch (...)
	{
		is_ok		   = false;
		internal_error = true;
	}

	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = 0;
	}

	if (internal_error)
	{
		throw 0;
	}

	return is_ok;
}